

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troff_display_driver.cpp
# Opt level: O3

void __thiscall TroffDisplayDriver::display(TroffDisplayDriver *this,Document *doc,ostream *output)

{
  bool bVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char cVar15;
  bool bVar16;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  Document *local_40;
  ulong local_38;
  
  lVar5 = Document::size();
  if (lVar5 != 0) {
    uVar13 = 0;
    local_40 = doc;
    do {
      plVar6 = (long *)Document::operator[]((ulong)doc);
      uVar3 = (**(code **)(*plVar6 + 8))(plVar6);
      cVar2 = (char)output;
      local_38 = uVar13;
      switch(uVar3) {
      case 1:
        pcVar14 = ".TH ";
        break;
      case 2:
        pcVar14 = ".SH ";
        break;
      case 3:
        pcVar14 = ".SS ";
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>(output,".PP",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar2);
        cVar15 = cVar2;
        goto LAB_001226b3;
      case 8:
        std::__ostream_insert<char,std::char_traits<char>>(output,".TP",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar2);
        std::ostream::put(cVar2);
        poVar11 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,".BR ",4);
        cVar15 = (char)poVar11;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + cVar15);
LAB_001226b3:
        std::ostream::put(cVar15);
        std::ostream::flush();
        goto LAB_001226c0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar14,4);
LAB_001226c0:
      lVar5 = Paragraph::size();
      if (lVar5 != 0) {
        uVar13 = 0;
        local_48 = plVar6;
        do {
          plVar7 = (long *)Paragraph::operator[]((ulong)plVar6);
          if (plVar7 == (long *)0x0) {
            bVar16 = true;
            lVar5 = 0;
            bVar1 = false;
LAB_0012286a:
            (**(code **)(*plVar7 + 0x10))(&local_68,plVar7);
            std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_68,local_60);
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
            }
          }
          else {
            lVar5 = __dynamic_cast(plVar7,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
            lVar8 = __dynamic_cast(plVar7,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
            lVar9 = __dynamic_cast(plVar7,&LineElement::typeinfo,&CodeLineElement::typeinfo);
            lVar10 = __dynamic_cast(plVar7,&LineElement::typeinfo,&UrlLineElement::typeinfo);
            bVar1 = lVar8 != 0;
            if (lVar8 == 0) {
              if (lVar5 != 0) {
                pcVar14 = "\\fB";
                goto LAB_001227a9;
              }
              if (lVar9 != 0) {
                (**(code **)(*local_48 + 8))();
              }
              lVar5 = 0;
            }
            else {
              pcVar14 = "\\fI";
LAB_001227a9:
              std::__ostream_insert<char,std::char_traits<char>>(output,pcVar14,3);
            }
            bVar16 = lVar9 == 0;
            plVar6 = local_48;
            if (lVar10 == 0) goto LAB_0012286a;
            std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar2);
            std::ostream::put(cVar2);
            poVar11 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,".IR ",4);
            UrlLineElement::url_abi_cxx11_();
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_68,local_60);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            plVar6 = local_48;
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
              plVar6 = local_48;
            }
          }
          if ((bool)(lVar5 != 0 | bVar1)) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"\\fR",3);
          }
          else if (!bVar16) {
            (**(code **)(*plVar6 + 8))(plVar6);
          }
          uVar13 = uVar13 + 1;
          uVar12 = Paragraph::size();
        } while (uVar13 < uVar12);
      }
      uVar4 = (**(code **)(*plVar6 + 8))(plVar6);
      if ((uVar4 & 0xfffffffe) != 10) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      doc = local_40;
      uVar13 = local_38 + 1;
      uVar12 = Document::size();
    } while (uVar13 < uVar12);
  }
  return;
}

Assistant:

void TroffDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		is_quotation(false),
		is_ulist(false);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << ".TH ";
				break;
			case Paragraph::Level::Title2:
				output << ".SH ";
				break;
			case Paragraph::Level::Title3:
				output << ".SS ";
				break;
			case Paragraph::Level::UList1:
				output << ".TP" << endl << ".BR " << endl;
				break;
			case Paragraph::Level::Code:
			case Paragraph::Level::Quote:
			default:
				output << ".PP" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "\\fI";
			} else if (bold_le) {
				output << "\\fB";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
			
			if (url_le) {
				output << endl << ".IR " << url_le->url() << endl;
			} else {
				output << l->content();
			}

			if (italic_le or bold_le) {
				output << "\\fR";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				break;
			case Paragraph::Level::Quote:
				break;
			case Paragraph::Level::UList1:
			case Paragraph::Level::Title1:
			case Paragraph::Level::Title2:
			default:
				output << endl;
				break;
		}
	}
}